

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O2

int testDcmBiasEstimator(int errorCode)

{
  long time;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pdVar5;
  bool bVar6;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar7;
  StorageBaseType *pSVar8;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pMVar9;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar10;
  long lVar11;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar12;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar13;
  ostream *poVar14;
  int i;
  long lVar15;
  undefined8 uVar16;
  RealScalar RVar17;
  RealScalar RVar18;
  double local_cf0;
  Vector2 local_cd8;
  double dt;
  Vector log_k;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c98;
  double dcmMeasurementErrorStd;
  double zmpMeasurementErrorStd;
  double biasDriftPerSecondStd;
  vector<double,_std::allocator<double>_> kappa;
  Vector2 local_c48;
  Vector2 deviation;
  double initBiasstd;
  vector<double,_std::allocator<double>_> yaw;
  IndexedVectorArray zmp_m;
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> local_b98 [24];
  IndexedVectorArray dcm_hat;
  IndexedVectorArray bias_hat;
  IndexedVectorArray dcm_m;
  IndexedVectorArray log;
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> local_9f8 [16];
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> local_9e8 [16];
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  Matrix<double,_2,_2,_0,_2,_2> local_9b8;
  undefined8 uStack_998;
  undefined8 local_990;
  Matrix<double,_2,_2,_0,_2,_2> local_988;
  undefined8 uStack_968;
  undefined8 local_960;
  Matrix<double,_2,_2,_0,_2,_2> local_958;
  undefined8 uStack_938;
  undefined8 local_930;
  Matrix<double,_2,_2,_0,_2,_2> local_928;
  undefined8 uStack_908;
  undefined8 local_900;
  Matrix<double,_2,_2,_0,_2,_2> local_8f8;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [24];
  ConstantReturnType local_880;
  ConstantReturnType local_870;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_860 [16];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_850 [16];
  IndexedVectorArray dcm;
  IndexedVectorArray dcm_m_unbiased;
  IndexedVectorArray localBias;
  IndexedVectorArray gamma;
  IndexedVectorArray zmp;
  IndexedVectorArray bias;
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> local_5e8 [16];
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  LipmDcmEstimator est;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_570;
  Vector2 *local_4d0;
  
  dt = 0.005;
  biasDriftPerSecondStd = 0.005;
  zmpMeasurementErrorStd = 0.001;
  dcmMeasurementErrorStd = 0.005;
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&dcm,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&localBias,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&bias,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&zmp,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&gamma,24000,0);
  std::vector<double,_std::allocator<double>_>::vector(&yaw,24000,(allocator_type *)&est);
  std::vector<double,_std::allocator<double>_>::vector(&kappa,24000,(allocator_type *)&est);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_898,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&dcm_m);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  local_598 = 0x3ff0000000000000;
  local_590 = 0;
  uStack_588 = 0;
  local_580 = 0x3ff0000000000000;
  stateObservation::tools::ProbabilityLawSimulation::
  getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
            ((Matrix<double,_2,_1,_0,_2,_1> *)&dcm_m_unbiased,
             (Matrix<double,_2,_2,_0,_2,_2> *)local_898,(Index)&local_598,2);
  zmp_m.k_ = CONCAT44(zmp_m.k_._4_4_,4);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&est,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&dcm_m_unbiased,(int *)&zmp_m);
  pMVar7 = stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[](&dcm,0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
            (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                     *)&est);
  initBiasstd = 0.01;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_8a8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&dcm_m);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  local_5b8 = 0x3ff0000000000000;
  local_5b0 = 0;
  uStack_5a8 = 0;
  local_5a0 = 0x3ff0000000000000;
  stateObservation::tools::ProbabilityLawSimulation::
  getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
            ((Matrix<double,_2,_1,_0,_2,_1> *)&dcm_m_unbiased,
             (Matrix<double,_2,_2,_0,_2,_2> *)local_8a8,(Index)&local_5b8,2);
  zmp_m.k_ = 0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&est,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&dcm_m_unbiased,(double *)&zmp_m
            );
  pMVar7 = stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[](&localBias,0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
            (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                     *)&est);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_8b8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&dcm_m);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  local_5d8 = 0x3ff0000000000000;
  local_5d0 = 0;
  uStack_5c8 = 0;
  local_5c0 = 0x3ff0000000000000;
  stateObservation::tools::ProbabilityLawSimulation::
  getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
            ((Matrix<double,_2,_1,_0,_2,_1> *)&dcm_m_unbiased,
             (Matrix<double,_2,_2,_0,_2,_2> *)local_8b8,(Index)&local_5d8,2);
  zmp_m.k_ = 0x3fa999999999999a;
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&est,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&dcm_m_unbiased,(double *)&zmp_m
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&deviation,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
              *)&est);
  dcm_m.k_ = 0x3ff9b28d075b19a1;
  pSVar8 = (StorageBaseType *)
           stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[](&dcm,0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&dcm_m_unbiased,(double *)&dcm_m,pSVar8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
               *)&est,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       *)&dcm_m_unbiased,
              (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&deviation);
  pMVar7 = stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[](&zmp,0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                     *)&est);
  lVar15 = 0;
  for (lVar11 = 0; lVar11 != 0x2edf8; lVar11 = lVar11 + 8) {
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              (local_8c8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&dcm_m_unbiased);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    local_8f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = 1.0;
    local_8f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = 0.0;
    uStack_8d8 = 0;
    local_8d0 = 0x3ff0000000000000;
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              ((Matrix<double,_2,_1,_0,_2,_1> *)&est,(Matrix<double,_2,_2,_0,_2,_2> *)local_8c8,
               (Index)(local_8f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array + 2),2);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&gamma,lVar15);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,2,1,0,2,1>>
              (pMVar7,(Matrix<double,_2,_1,_0,_2,_1> *)&est);
    uVar16 = stateObservation::tools::ProbabilityLawSimulation::getUniformScalar(0.5,1.5);
    *(undefined8 *)
     ((long)kappa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar11) = uVar16;
    pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm,lVar15);
    bias_hat.k_ = (TimeIndex)(dt * 3.2998316455372216);
    this = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
           stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[](&dcm,lVar15);
    pdVar5 = kappa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar8 = (StorageBaseType *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&zmp,lVar15);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)&dcm_hat,(double *)((long)pdVar5 + lVar11),pSVar8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&zmp_m,this,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&dcm_hat);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&gamma,lVar15);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *)&dcm_m,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&zmp_m,pMVar10);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&dcm_m_unbiased,(double *)&bias_hat,(StorageBaseType *)&dcm_m);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&est,pMVar9,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&dcm_m_unbiased);
    time = lVar15 + 1;
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm,time);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
              (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                       *)&est);
    pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&localBias,lVar15);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_8f8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&dcm_hat);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    local_928.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = 1.0;
    local_928.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = 0.0;
    uStack_908 = 0;
    local_900 = 0x3ff0000000000000;
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              ((Matrix<double,_2,_1,_0,_2,_1> *)&zmp_m,&local_8f8,
               (Index)(local_928.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array + 2),2);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&dcm_m,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&zmp_m,
               &biasDriftPerSecondStd);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                 *)&dcm_m_unbiased,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
                 *)&dcm_m,&dt);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&est,pMVar9,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&dcm_m_unbiased);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&localBias,time);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
              (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                       *)&est);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_928,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&dcm_m);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    local_958.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = 1.0;
    local_958.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = 0.0;
    uStack_938 = 0;
    local_930 = 0x3ff0000000000000;
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              ((Matrix<double,_2,_1,_0,_2,_1> *)&dcm_m_unbiased,&local_928,
               (Index)(local_958.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array + 2),2);
    zmp_m.k_ = 0x3fa999999999999a;
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&est,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&dcm_m_unbiased,
               (double *)&zmp_m);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&deviation,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&est);
    log_k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         (1.0 / *(double *)
                 ((long)kappa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11));
    local_c48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = 1.6060915267313265;
    pSVar8 = (StorageBaseType *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm,lVar15);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)&dcm_hat,(double *)&local_c48,pSVar8);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&gamma,lVar15);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *)&zmp_m,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&dcm_hat,pMVar10);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&dcm_m,(double *)&log_k,(StorageBaseType *)&zmp_m);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_958,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&local_c98);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    local_988.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = 1.0;
    local_988.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = 0.0;
    uStack_968 = 0;
    local_960 = 0x3ff0000000000000;
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              ((Matrix<double,_2,_1,_0,_2,_1> *)&log,&local_958,
               (Index)(local_988.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array + 2),2);
    local_cd8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = 0.05;
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&bias_hat,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&log,(double *)&local_cd8
              );
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                 *)&dcm_m_unbiased,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&dcm_m,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                 *)&bias_hat);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
    ::CwiseBinaryOp(&local_570,
                    (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                     *)&dcm_m_unbiased);
    local_4d0 = &deviation;
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&zmp,time);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                       *)&est);
    lVar15 = time;
  }
  for (lVar15 = 0; lVar15 != 24000; lVar15 = lVar15 + 1) {
    dcm_m_unbiased.k_ =
         stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(6.283185307179586,0.0)
    ;
    yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar15] = (double)dcm_m_unbiased.k_;
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[](&localBias,lVar15);
    Eigen::RotationBase<Eigen::Rotation2D<double>,2>::
    _transformVector<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((RotationBase<Eigen::Rotation2D<double>,2> *)&est,
               (Matrix<double,__1,_1,_0,__1,_1> *)&dcm_m_unbiased);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&bias,lVar15);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,2,1,0,2,1>>
              (pMVar7,(Matrix<double,_2,_1,_0,_2,_1> *)&est);
  }
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&dcm_m_unbiased,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&dcm_m,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&zmp_m,24000,0);
  lVar15 = 1;
  for (lVar11 = 0; lVar11 != 24000; lVar11 = lVar11 + 1) {
    pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm,lVar11);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_988,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&log);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    local_9b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = 1.0;
    local_9b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = 0.0;
    uStack_998 = 0;
    local_990 = 0x3ff0000000000000;
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              ((Matrix<double,_2,_1,_0,_2,_1> *)&bias_hat,&local_988,
               (Index)(local_9b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array + 2),2);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&dcm_hat,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&bias_hat,
               &dcmMeasurementErrorStd);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&est,pMVar9,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&dcm_hat);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm_m_unbiased,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
              (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                       *)&est);
    pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm_m_unbiased,lVar11);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&bias,lVar11);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&est,pMVar9,pMVar10);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm_m,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)&est);
    pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&zmp,lVar11);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_9b8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&log);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    local_9d8 = 0x3ff0000000000000;
    local_9d0 = 0;
    uStack_9c8 = 0;
    local_9c0 = 0x3ff0000000000000;
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              ((Matrix<double,_2,_1,_0,_2,_1> *)&bias_hat,&local_9b8,(Index)&local_9d8,2);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&dcm_hat,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&bias_hat,
               &zmpMeasurementErrorStd);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&est,pMVar9,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&dcm_hat);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&zmp_m,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
              (pMVar7,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                       *)&est);
  }
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&dcm_hat,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&bias_hat,24000,0);
  dVar4 = biasDriftPerSecondStd;
  dVar3 = zmpMeasurementErrorStd;
  dVar2 = dcmMeasurementErrorStd;
  dVar1 = dt;
  local_c48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_c48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            ((ConstantReturnType *)&local_c98,
             (Scalar *)&stateObservation::LipmDcmEstimator::defaultBiasLimit);
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&log,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_c98);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&log_k,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_cd8);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_b98,local_850);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_9e8,local_860);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            (&local_870,(Scalar *)&stateObservation::LipmDcmEstimator::defaultDCMUncertainty);
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_9f8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_870);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            (&local_880,(Scalar *)&stateObservation::LipmDcmEstimator::defaultBiasUncertainty);
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_5e8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_880);
  stateObservation::LipmDcmEstimator::LipmDcmEstimator
            (&est,dVar1,3.2998316455372216,dVar4,dVar2,dVar3,(Matrix *)&log,(Matrix *)&log_k,
             (Matrix *)local_b98,(Matrix *)local_9e8,(Matrix *)local_9f8,(Matrix *)local_5e8);
  pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::operator[](&dcm_m,0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&log,pDVar12);
  pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::operator[](&zmp_m,0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_c98,pDVar12);
  dVar1 = *yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            ((ConstantReturnType *)&local_cd8,&initBiasstd);
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&log_k,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_cd8);
  stateObservation::LipmDcmEstimator::resetWithMeasurements
            (&est,(Vector2 *)&log,(Vector2 *)&local_c98,dVar1,true,&local_c48,(Vector2 *)&log_k);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&log);
  do {
    if (lVar15 == 24000) {
      local_cf0 = 0.0;
      for (lVar15 = 0x5db6; lVar15 != 24000; lVar15 = lVar15 + 1) {
        pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 stateObservation::
                 IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::operator[](&dcm_hat,lVar15);
        pMVar10 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  stateObservation::
                  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator[](&dcm,lVar15);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_c98,pMVar9,pMVar10);
        RVar17 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_c98);
        pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 stateObservation::
                 IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::operator[](&bias_hat,lVar15);
        pMVar10 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  stateObservation::
                  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator[](&bias,lVar15);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&log_k,pMVar9,pMVar10);
        RVar18 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&log_k);
        local_cf0 = local_cf0 + RVar17 + RVar18;
      }
      std::operator<<((ostream *)&std::cout,"Sum of error on the 10 last samples = ");
      poVar14 = std::ostream::_M_insert<double>(local_cf0);
      std::endl<char,std::char_traits<char>>(poVar14);
      if (local_cf0 <= 0.07) {
        errorCode = 0;
      }
LAB_00104d10:
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&log.v_);
      stateObservation::LipmDcmEstimator::~LipmDcmEstimator(&est);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&bias_hat.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&dcm_hat.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&zmp_m.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&dcm_m.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&dcm_m_unbiased.v_);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&kappa.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&yaw.super__Vector_base<double,_std::allocator<double>_>);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&gamma.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&zmp.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&bias.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&localBias.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~deque(&dcm.v_);
      return errorCode;
    }
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&dcm_m,lVar15);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_c98,pDVar12);
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&zmp_m,lVar15);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&log_k,pDVar12);
    dVar1 = yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar15];
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&gamma,lVar15 + -1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_cd8,pDVar12);
    stateObservation::LipmDcmEstimator::setInputs
              (&est,(Vector2 *)&local_c98,(Vector2 *)&log_k,dVar1,&local_cd8,
               kappa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15 + -1]);
    stateObservation::LipmDcmEstimator::update();
    stateObservation::LipmDcmEstimator::getBias();
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&bias_hat,lVar15);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,2,1,0,2,1>>
              (pMVar7,(Matrix<double,_2,_1,_0,_2,_1> *)&local_c98);
    stateObservation::LipmDcmEstimator::getUnbiasedDCM();
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm_hat,lVar15);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,2,1,0,2,1>>
              (pMVar7,(Matrix<double,_2,_1,_0,_2,_1> *)&local_c98);
    pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&dcm_hat,lVar15);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&dcm_hat,lVar15);
    bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator!=(pMVar9,pMVar10);
    if (bVar6) {
      poVar14 = std::operator<<((ostream *)&std::cout,"NaN detected = ");
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)lVar15);
      poVar14 = std::operator<<(poVar14," ");
      local_c98.m_xpr =
           stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[](&dcm_hat,lVar15);
      poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           *)&local_c98);
      std::endl<char,std::char_traits<char>>(poVar14);
      goto LAB_00104d10;
    }
    local_c98.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)CONCAT44(local_c98.m_xpr._4_4_,0xb);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&log_k,(int *)&local_c98);
    local_cd8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = (double)(int)lVar15;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
              (&local_c98,(Matrix<double,__1,_1,_0,__1,_1> *)&log_k,(Scalar *)&local_cd8);
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&bias_hat,lVar15);
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c98,pDVar12);
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&localBias,lVar15);
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar13,pDVar12);
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&dcm_hat,lVar15);
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar13,pDVar12);
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&dcm_m_unbiased,lVar15);
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar13,pDVar12);
    pDVar12 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&dcm,lVar15);
    Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar13,pDVar12);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_c98);
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&log.v_,(value_type *)&log_k);
    free(log_k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

int testDcmBiasEstimator(int errorCode)
{
  double w0 = sqrt(cst::gravityConstant / 0.9);
  double dt = 0.005;

  double biasDriftPerSecondStd = 0.005;
  double zmpMeasurementErrorStd = 0.001;
  double dcmMeasurementErrorStd = 0.005;

  int signallength = int(120. / dt);

  ///////////////////////////////////////
  /// Build the ground truth signals
  ///////////////////////////////////////
  typedef tools::ProbabilityLawSimulation ran;
  IndexedVectorArray dcm(signallength), localBias(signallength), bias(signallength), zmp(signallength),
      gamma(signallength);
  std::vector<double> yaw(signallength), kappa(signallength);

  /// set the desired exponential convergence of the DCM
  double lambda = 2;

  /// initialize the dcm and localBias to a random value
  dcm[0] = ran::getGaussianMatrix<Vector2>() * 4;
  double initBiasstd = 0.01;

  localBias[0] = ran::getGaussianMatrix<Vector2>() * 0.01;
  Vector2 deviation = ran::getGaussianMatrix<Vector2>() * 0.05;
  zmp[0] = (lambda / w0 + 1) * dcm[0] + deviation;

  for(int i = 0; i < signallength - 1; ++i)
  {
    gamma[i] = ran::getGaussianMatrix<Vector2>();
    kappa[i] = ran::getUniformScalar(0.5, 1.5);
    /// dcm dynamics
    dcm[i + 1] = dcm[i] + dt * w0 * (dcm[i] - kappa[i] * zmp[i] + gamma[i]);
    /// local bias drift
    localBias[i + 1] = localBias[i] + ran::getGaussianMatrix<Vector2>() * biasDriftPerSecondStd * dt;
    /// set a noisy zmp to create  bounded drift of the DCM
    deviation += ran::getGaussianMatrix<Vector2>() * 0.05;
    zmp[i + 1] = (1. / kappa[i]) * ((lambda / w0 + 1) * dcm[i] + gamma[i]) + ran::getGaussianMatrix<Vector2>() * 0.05
                 + deviation;
  }

  for(int i = 0; i < signallength; ++i)
  {
    /// global-frame bias computation
    yaw[i] = ran::getGaussianScalar(2 * M_PI);
    bias[i] = Rotation2D(yaw[i]) * localBias[i];
  }

  /////////////////////////////////
  /// Build the measurements
  /////////////////////////////////
  IndexedVectorArray dcm_m_unbiased(signallength), dcm_m(signallength), zmp_m(signallength);

  for(int i = 0; i < signallength; ++i)
  {

    dcm_m_unbiased[i] = dcm[i] + ran::getGaussianMatrix<Vector2>() * dcmMeasurementErrorStd;
    dcm_m[i] = dcm_m_unbiased[i] + bias[i];
    zmp_m[i] = zmp[i] + ran::getGaussianMatrix<Vector2>() * zmpMeasurementErrorStd;
  }

  /////////////////////////////////
  /// Run the estimator
  /////////////////////////////////
  IndexedVectorArray dcm_hat(signallength), bias_hat(signallength);

  Vector2 initbias{0.0, 0.0};

  LipmDcmEstimator est(dt, w0, biasDriftPerSecondStd, dcmMeasurementErrorStd, zmpMeasurementErrorStd);

  est.resetWithMeasurements(dcm_m[0], zmp_m[0], yaw[0], true, initbias, Vector2::Constant(initBiasstd));

  IndexedVectorArray log;

  for(int i = 1; i < signallength; i++)
  {
    est.setInputs(dcm_m[i], zmp_m[i], yaw[i], gamma[i - 1], kappa[i - 1]);
    est.update();
    bias_hat[i] = est.getBias();
    dcm_hat[i] = est.getUnbiasedDCM();

    /// NaN detection
    if(dcm_hat[i] != dcm_hat[i])
    {
      std::cout << "NaN detected = " << i << " " << dcm_hat[i].transpose() << std::endl;
      return errorCode;
    }

    Vector log_k(11);

    log_k << i, bias_hat[i], localBias[i], dcm_hat[i], dcm_m_unbiased[i], dcm[i];
    log.pushBack(log_k);
  }

  /// uncomment the following line to have a bit of a log
  // log.writeInFile("dcm.txt");

  /////////////////////////////////
  /// Check the error
  /////////////////////////////////
  double error = 0;

  for(int i = signallength - 10; i < signallength; ++i)
  {
    error += (dcm_hat[i] - dcm[i]).norm() + (bias_hat[i] - bias[i]).norm();
  }

  std::cout << "Sum of error on the 10 last samples = " << error << std::endl;

  if(error > 0.07)
  {
    return errorCode;
  }
  else
  {
    return 0;
  }
}